

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nameset.cpp
# Opt level: O2

int __thiscall soplex::NameSet::remove(NameSet *this,char *__filename)

{
  int iVar1;
  char *local_18;
  
  local_18 = this->mem + (this->set).theitem[*(int *)(__filename + 4)].data;
  DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::remove(&this->hashtab,(char *)&local_18);
  iVar1 = DataSet<int>::remove(&this->set,__filename);
  return iVar1;
}

Assistant:

void NameSet::remove(const DataKey& p_key)
{
   assert(has(p_key));

   hashtab.remove(Name(&mem[set[p_key]]));
   set.remove(p_key);
}